

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O1

void __thiscall
StatAggregator::aggregateAndPrintStats(StatAggregator *this,char *title,int count,char *unit)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  stat_history_t *psVar2;
  long lVar3;
  pointer pcVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  char *this_00;
  StatAggregator *this_01;
  long lVar8;
  long lVar9;
  samples_t all_timings;
  int printed;
  allocator local_bd;
  uint local_bc;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  local_b8;
  char *local_a0;
  char *local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
  local_90;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  local_68;
  undefined1 local_50 [32];
  
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc = count;
  local_a0 = title;
  local_98 = unit;
  if (0 < this->num_stats) {
    paVar1 = &local_90.first.field_2;
    lVar9 = 0;
    do {
      if (1 < this->num_samples) {
        lVar7 = 1;
        lVar8 = 0x60;
        do {
          psVar2 = this->t_stats[lVar9];
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&psVar2->latencies,
                     (psVar2->latencies).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,*(undefined8 *)((long)psVar2 + lVar8 + -8),
                     *(undefined8 *)((long)&(psVar2->name)._M_dataplus._M_p + lVar8));
          psVar2 = this->t_stats[lVar9];
          lVar3 = *(long *)((long)psVar2 + lVar8 + -8);
          if (*(long *)((long)&(psVar2->name)._M_dataplus._M_p + lVar8) != lVar3) {
            *(long *)((long)&(psVar2->name)._M_dataplus._M_p + lVar8) = lVar3;
          }
          lVar7 = lVar7 + 1;
          lVar8 = lVar8 + 0x38;
        } while (lVar7 < this->num_samples);
      }
      psVar2 = this->t_stats[lVar9];
      pcVar4 = (psVar2->name)._M_dataplus._M_p;
      local_90.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,pcVar4 + (psVar2->name)._M_string_length);
      local_90.second = &psVar2->latencies;
      std::
      vector<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>,std::allocator<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>>
      ::
      emplace_back<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>
                ((vector<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>,std::allocator<std::pair<std::__cxx11::string,std::vector<unsigned_long,std::allocator<unsigned_long>>*>>>
                  *)&local_b8,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_90.first._M_dataplus._M_p);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->num_stats);
  }
  pcVar5 = local_98;
  local_90.first._M_dataplus._M_p = local_90.first._M_dataplus._M_p & 0xffffffff00000000;
  this_00 = "\n===== Avg Latencies (%s) - %d samples (%s) %n";
  printf("\n===== Avg Latencies (%s) - %d samples (%s) %n",local_a0,(ulong)local_bc,local_98,
         &local_90);
  fillLineWith((StatAggregator *)this_00,'=',0x58 - (int)local_90.first._M_dataplus._M_p);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::vector(&local_68,&local_b8);
  this_01 = (StatAggregator *)local_50;
  std::__cxx11::string::string((string *)this_01,pcVar5,&local_bd);
  printValues(this_01,&local_68,(string *)local_50);
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::~vector(&local_68);
  iVar6 = 0x57;
  do {
    putchar(0x3d);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  putchar(10);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void StatAggregator::aggregateAndPrintStats(const char* title, int count,
                                            const char* unit) {

    samples_t all_timings;
    for (int i = 0; i < num_stats; ++i) {
        for (int j = 1; j < num_samples; ++j) {
            t_stats[i][0].latencies.insert(t_stats[i][0].latencies.end(),
                                           t_stats[i][j].latencies.begin(),
                                           t_stats[i][j].latencies.end());
            t_stats[i][j].latencies.clear();
        }

        all_timings.push_back(std::make_pair(t_stats[i][0].name,
                                             &t_stats[i][0].latencies));
    }

    int printed = 0;
    printf("\n===== Avg Latencies (%s) - %d samples (%s) %n",
            title, count, unit, &printed);
    fillLineWith('=', 88-printed);

    printValues(all_timings, unit);

    fillLineWith('=', 87);
}